

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
          (ImmutableExtensionLiteGenerator *this)

{
  ImmutableExtensionLiteGenerator *in_RDI;
  
  ~ImmutableExtensionLiteGenerator(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator() {}